

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<char16_t*>
          (BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key,ArenaMemoryDataSummary **value)

{
  long lVar1;
  int iVar2;
  char16_t *pcVar3;
  ulong uVar4;
  char16_t cVar5;
  uint uVar6;
  uint uVar7;
  hash_t hVar8;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    pcVar3 = *key;
    cVar5 = *pcVar3;
    if (cVar5 == L'\0') {
      hVar8 = 0x11c9dc5;
    }
    else {
      uVar6 = 0x811c9dc5;
      do {
        pcVar3 = pcVar3 + 1;
        uVar7 = (ushort)cVar5 ^ uVar6;
        uVar6 = uVar7 * 0x1000193;
        cVar5 = *pcVar3;
      } while (cVar5 != L'\0');
      hVar8 = uVar7 * 0x2000326 >> 1;
    }
    hVar8 = PrimePolicy::ModPrime(hVar8,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar6 = *(uint *)(lVar1 + (ulong)hVar8 * 4);
    depth = 0;
    if (-1 < (int)uVar6) {
      lVar1 = *(long *)(this + 8);
      depth = 0;
      do {
        uVar4 = (ulong)uVar6;
        iVar2 = PAL_wcscmp(*(char16_t **)(lVar1 + 0x10 + uVar4 * 0x18),*key);
        if (iVar2 == 0) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
          }
          *value = *(ArenaMemoryDataSummary **)(*(long *)(this + 8) + uVar4 * 0x18);
          return true;
        }
        depth = depth + 1;
        uVar6 = *(uint *)(uVar4 * 0x18 + lVar1 + 8);
      } while (-1 < (int)uVar6);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }